

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int LoadStorageValue(uint position)

{
  uchar *data;
  int iVar1;
  int *dataPtr;
  uint dataSize;
  uint local_21c;
  char local_218 [512];
  
  iVar1 = 0;
  memset(local_218 + 0xd,0,499);
  builtin_strncpy(local_218,"storage.data",0xd);
  local_21c = 0;
  data = LoadFileData(local_218,&local_21c);
  if (data != (uchar *)0x0) {
    if (local_21c < position * 4) {
      iVar1 = 0;
      TraceLog(4,"SYSTEM: Failed to find storage position");
    }
    else {
      iVar1 = *(int *)(data + (ulong)position * 4);
    }
    UnloadFileData(data);
  }
  return iVar1;
}

Assistant:

int LoadStorageValue(unsigned int position)
{
    int value = 0;

#if defined(SUPPORT_DATA_STORAGE)
    char path[512] = { 0 };
#if defined(PLATFORM_ANDROID)
    strcpy(path, CORE.Android.internalDataPath);
    strcat(path, "/");
    strcat(path, STORAGE_DATA_FILE);
#elif defined(PLATFORM_UWP)
    strcpy(path, CORE.UWP.internalDataPath);
    strcat(path, "/");
    strcat(path, STORAGE_DATA_FILE);
#else
    strcpy(path, STORAGE_DATA_FILE);
#endif

    unsigned int dataSize = 0;
    unsigned char *fileData = LoadFileData(path, &dataSize);

    if (fileData != NULL)
    {
        if (dataSize < (position*4)) TRACELOG(LOG_WARNING, "SYSTEM: Failed to find storage position");
        else
        {
            int *dataPtr = (int *)fileData;
            value = dataPtr[position];
        }

        UnloadFileData(fileData);
    }
#endif
    return value;
}